

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool cmGlobalGenerator::IsReservedTarget(string *name)

{
  char **ppcVar1;
  char **ppcVar2;
  char *local_68;
  char *reservedTargets [10];
  string *name_local;
  
  memcpy(&local_68,&DAT_00ae27f0,0x50);
  ppcVar1 = std::cbegin<char_const*[10]>((char *(*) [10])&local_68);
  ppcVar2 = std::cend<char_const*[10]>((char *(*) [10])&local_68);
  ppcVar1 = std::find<char_const*const*,std::__cxx11::string>(ppcVar1,ppcVar2,name);
  ppcVar2 = std::cend<char_const*[10]>((char *(*) [10])&local_68);
  return ppcVar1 != ppcVar2;
}

Assistant:

bool cmGlobalGenerator::IsReservedTarget(std::string const& name)
{
  // The following is a list of targets reserved
  // by one or more of the cmake generators.

  // Adding additional targets to this list will require a policy!
  const char* reservedTargets[] = { "all",       "ALL_BUILD",  "help",
                                    "install",   "INSTALL",    "preinstall",
                                    "clean",     "edit_cache", "rebuild_cache",
                                    "ZERO_CHECK" };

  return std::find(cm::cbegin(reservedTargets), cm::cend(reservedTargets),
                   name) != cm::cend(reservedTargets);
}